

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall PDA::Transducer::Generator::writeGlobalFunctions(Generator *this,wostream *stream)

{
  pointer pIVar1;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *pvVar2;
  wostream *pwVar3;
  pointer pIVar4;
  wstring local_50;
  
  pvVar2 = Tokenizer::identifiers(this->m_tokenizer);
  pIVar1 = (pvVar2->
           super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar4 = (pvVar2->
                super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                )._M_impl.super__Vector_impl_data._M_start; pIVar4 != pIVar1; pIVar4 = pIVar4 + 1) {
    if (pIVar4->type == Function) {
      pwVar3 = std::operator<<(stream,L".globl ");
      hash(&local_50,&pIVar4->decoratedName);
      pwVar3 = std::operator<<(pwVar3,(wstring *)&local_50);
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
      std::__cxx11::wstring::~wstring((wstring *)&local_50);
    }
  }
  return;
}

Assistant:

void Generator::writeGlobalFunctions(std::wostream &stream)
{
    for(const Identifier &id : m_tokenizer.identifiers())
    {
        if (id.type == Identifier::Type::Function)
        {
            stream << L".globl " << hash(id.decoratedName) << std::endl;
        }
    }
}